

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::TextTemplateToken::~TextTemplateToken(TextTemplateToken *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TextTemplateToken_0041e380;
  std::__cxx11::string::~string((string *)(in_RDI + 6));
  TemplateToken::~TemplateToken((TemplateToken *)0x3157e4);
  return;
}

Assistant:

TextTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, const std::string& t) : TemplateToken(Type::Text, loc, pre, post), text(t) {}